

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

iterator __thiscall QString::erase(QString *this,const_iterator first,const_iterator last)

{
  Data *pDVar1;
  long lVar2;
  
  lVar2 = (long)first - (long)(this->d).ptr;
  remove(this,(char *)(lVar2 >> 1));
  pDVar1 = (this->d).d;
  if ((pDVar1 == (Data *)0x0) ||
     (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    reallocData(this,(this->d).size,KeepSize);
  }
  return (iterator)(lVar2 + (long)(this->d).ptr);
}

Assistant:

QString::iterator QString::erase(QString::const_iterator first, QString::const_iterator last)
{
    const auto start = std::distance(cbegin(), first);
    const auto len = std::distance(first, last);
    remove(start, len);
    return begin() + start;
}